

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void write_timer(memfile *mf,timer_element *timer)

{
  bool local_21;
  int32_t iStack_20;
  boolean needs_fixup;
  long argval;
  timer_element *timer_local;
  memfile *mf_local;
  
  local_21 = false;
  if ((ushort)timer->kind < 2) {
    iStack_20 = (int32_t)timer->arg;
  }
  else {
    if (timer->kind != 2) {
      panic("write_timer");
    }
    local_21 = (timer->field_0x1b & 1) == 0;
    if (local_21) {
      iStack_20 = *(int32_t *)((long)timer->arg + 0x18);
    }
    else {
      iStack_20 = (int32_t)timer->arg;
    }
  }
  mtag(mf,(ulong)timer->tid,MTAG_TIMER);
  mwrite32(mf,timer->tid);
  mwrite32(mf,timer->timeout);
  mwrite32(mf,iStack_20);
  mwrite16(mf,timer->kind);
  mwrite8(mf,timer->func_index);
  mwrite8(mf,local_21);
  return;
}

Assistant:

static void write_timer(struct memfile *mf, timer_element *timer)
{
    long argval;
    boolean needs_fixup = FALSE;

    switch (timer->kind) {
	case TIMER_GLOBAL:
	case TIMER_LEVEL:
	    /* assume no pointers in arg */
	    argval = (long)timer->arg;
	    break;

	case TIMER_OBJECT:
	    if (timer->needs_fixup)
		argval = (long)timer->arg;
	    else {
		/* replace object pointer with id */
		argval = ((struct obj *)timer->arg)->o_id;
		needs_fixup = TRUE;
	    }
	    break;

	default:
	    panic("write_timer");
	    break;
    }

    mtag(mf, timer->tid, MTAG_TIMER);
    mwrite32(mf, timer->tid);
    mwrite32(mf, timer->timeout);
    mwrite32(mf, argval);
    mwrite16(mf, timer->kind);
    mwrite8(mf, timer->func_index);
    mwrite8(mf, needs_fixup);
}